

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O0

void __thiscall
sig::
Signal_impl<void_(const_cppurses::Glyph_string_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(const_cppurses::Glyph_string_&)>,_std::mutex>
::Connection_container::Connection_container(Connection_container *this,less<int> *compare)

{
  less<int> *__comp;
  allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>_>_>
  local_19;
  less<int> *local_18;
  less<int> *compare_local;
  Connection_container *this_local;
  
  local_18 = compare;
  compare_local = (less<int> *)this;
  std::
  deque<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>
  ::deque(&this->front);
  __comp = local_18;
  std::
  allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>_>_>
  ::allocator(&local_19);
  std::
  map<int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>_>_>_>
  ::map(&this->grouped,__comp,&local_19);
  std::
  allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>_>_>
  ::~allocator(&local_19);
  std::
  deque<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(const_cppurses::Glyph_string_&)>_>_>_>
  ::deque(&this->back);
  return;
}

Assistant:

Connection_container(const Group_compare& compare) : grouped{compare} {}